

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_demovfs.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  unqlite *pDb;
  char zKey [12];
  char zData [34];
  unqlite *local_60;
  int local_54 [3];
  char *local_48 [5];
  
  puts(
      "============================================================\nUnQLite VFS DemoFile Functions                              \n                                         http://unqlite.org/\n============================================================\n"
      );
  puts("Starting vfs set\n");
  iVar1 = unqlite_lib_config(6,&unqliteExportDemoVfs::demovfs);
  if (iVar1 == 0) {
    iVar1 = unqlite_lib_config(8,0x200);
    if (iVar1 == 0) {
      puts("Successfully vfs set\n");
      if (argc < 2) {
        pcVar3 = ":mem:";
      }
      else {
        pcVar3 = argv[1];
      }
      iVar1 = unqlite_open(&local_60,pcVar3,4);
      if (iVar1 == 0) {
        iVar1 = 0x14;
        do {
          unqlite_util_random_string(local_60,(char *)local_54,0xc);
          iVar2 = unqlite_kv_store(local_60,local_54,0xc,local_48,0x22);
          if (iVar2 != 0) {
            iVar1 = unqlite_rollback(local_60);
            puts("Rollback OK, even if it wasn\'t expected");
            if (iVar1 != 0) {
              if (local_60 == (unqlite *)0x0) goto LAB_0010a945;
              local_54[0] = 0;
              unqlite_config(local_60,3,local_48,local_54);
              if (local_54[0] < 1) goto LAB_0010a945;
              goto LAB_0010a940;
            }
            break;
          }
          puts("Key Successfully stored");
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
        unqlite_close(local_60);
        puts("AutoCommit and Close");
        return 0;
      }
      local_48[0] = "Out of memory";
LAB_0010a940:
      puts(local_48[0]);
LAB_0010a945:
      unqlite_lib_shutdown();
      goto LAB_0010a94a;
    }
    pcVar3 = "Error in setting PageSize";
  }
  else {
    pcVar3 = "Error in VFS configuration";
  }
  puts(pcVar3);
LAB_0010a94a:
  exit(0);
}

Assistant:

int main(int argc,char *argv[])
{
	unqlite *pDb;       /* Database handle */
	int rc;
	int i;
	
	/* Print Banner */
	puts(zBanner);
	puts("Starting vfs set\n");	
	/* Configure with our own vfs and page size */
	unqlite_start();
	puts("Successfully vfs set\n");	
	
	/* Open our database */
	/* Pass a real db file to test the this vfs*/
	rc = unqlite_open(&pDb,argc > 1 ? argv[1] /* On-disk DB */ : ":mem:" /* In-mem DB */,UNQLITE_OPEN_CREATE);
	if( rc != UNQLITE_OK ){
		Fatal(0,"Out of memory");
	}
	/* Taken from 1.c, just store some values as example */
	/* Store 20 random records.*/
	for(i = 0 ; i < 20 ; ++i ){
		char zKey[12]; /* Random generated key */
		char zData[34]; /* Dummy data */
		
		/* Generate the random key */
		unqlite_util_random_string(pDb,zKey,sizeof(zKey));
		
		/* Perform the insertion */
		rc = unqlite_kv_store(pDb,zKey,sizeof(zKey),zData,sizeof(zData));
		if( rc != UNQLITE_OK ){
			break;
		}
		puts("Key Successfully stored");
	}
	if( rc != UNQLITE_OK ){
		/* Insertion fail, rollback the transaction  */
		rc = unqlite_rollback(pDb);
		puts("Rollback OK, even if it wasn't expected");
		if( rc != UNQLITE_OK ){
			/* Extract database error log and exit */
			Fatal(pDb,0);
		}
	}
	
	/* Auto-commit the transaction and close our handle */
	unqlite_close(pDb);
	puts("AutoCommit and Close");
}